

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EfiTianoCompressLegacy.c
# Opt level: O2

void Output(UINT32 CharC,UINT32 Pos)

{
  uint uVar1;
  UINT8 *pUVar2;
  UINT16 *pUVar3;
  uint uVar4;
  bool bVar5;
  
  uVar4 = mOutputMask >> 1;
  bVar5 = mOutputMask < 2;
  pUVar2 = mBuf;
  uVar1 = mOutputPos;
  mOutputMask = uVar4;
  if (bVar5) {
    mOutputMask = 0x80;
    if (mBufSiz - 0x28 <= mOutputPos) {
      SendBlock();
      mOutputPos = 0;
    }
    pUVar2 = mBuf;
    Output::CPos = mOutputPos;
    mBuf[mOutputPos] = '\0';
    uVar4 = 0x80;
    uVar1 = mOutputPos + 1;
  }
  mOutputPos = uVar1 + 1;
  pUVar2[uVar1] = (UINT8)CharC;
  mCFreq[CharC] = mCFreq[CharC] + 1;
  if (0xff < CharC) {
    pUVar2[Output::CPos] = pUVar2[Output::CPos] | (byte)uVar4;
    pUVar2[uVar1 + 1] = '\0';
    pUVar2[uVar1 + 2] = (UINT8)(Pos >> 0x10);
    pUVar2[uVar1 + 3] = (UINT8)(Pos >> 8);
    mOutputPos = uVar1 + 5;
    pUVar2[uVar1 + 4] = (UINT8)Pos;
    pUVar3 = mPFreq;
    for (; Pos != 0; Pos = Pos >> 1) {
      pUVar3 = pUVar3 + 1;
    }
    *pUVar3 = *pUVar3 + 1;
  }
  return;
}

Assistant:

STATIC
  VOID
  Output (
  UINT32 CharC,
  UINT32 Pos
  )
  /*++

  Routine Description:

  Outputs an Original Character or a Pointer

  Arguments:

  CharC     - The original character or the 'String Length' element of a Pointer
  Pos     - The 'Position' field of a Pointer

  Returns: (VOID)

  --*/
{
  STATIC UINT32 CPos;

  if ((mOutputMask >>= 1) == 0) {
    mOutputMask = 1U << (UINT8_BIT - 1);
    //
    // Check the buffer overflow per outputting UINT8_BIT symbols
    // which is an Original Character or a Pointer. The biggest
    // symbol is a Pointer which occupies 5 bytes.
    //
    if (mOutputPos >= mBufSiz - 5 * UINT8_BIT) {
      SendBlock ();
      mOutputPos = 0;
    }

    CPos        = mOutputPos++;
    mBuf[CPos]  = 0;
  }

  mBuf[mOutputPos++] = (UINT8) CharC;
  mCFreq[CharC]++;
  if (CharC >= (1U << UINT8_BIT)) {
    mBuf[CPos] |= mOutputMask;
    mBuf[mOutputPos++]  = (UINT8) (Pos >> 24);
    mBuf[mOutputPos++]  = (UINT8) (Pos >> 16);
    mBuf[mOutputPos++]  = (UINT8) (Pos >> (UINT8_BIT));
    mBuf[mOutputPos++]  = (UINT8) Pos;
    CharC               = 0;
    while (Pos) {
      Pos >>= 1;
      CharC++;
    }

    mPFreq[CharC]++;
  }
}